

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

bool __thiscall
s2textformat::InternalMakePolygon
          (s2textformat *this,string_view str,S2Debug debug_override,bool normalize_loops,
          unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *polygon)

{
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000009;
  _Head_base<0UL,_S2Loop_*,_false> _Var3;
  pointer psVar4;
  undefined7 in_register_00000081;
  size_type len;
  bool bVar5;
  string_view str_00;
  string_view str_01;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> loop;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  loops;
  vector<absl::string_view,_std::allocator<absl::string_view>_> loop_strs;
  S2Debug local_89;
  _Head_base<0UL,_S2Loop_*,_false> local_88;
  undefined4 local_7c;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  local_78;
  __uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_> *local_60;
  vector<absl::string_view,_std::allocator<absl::string_view>_> local_58;
  string_view local_40;
  
  psVar4 = (pointer)str.ptr_;
  local_60 = (__uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_> *)
             CONCAT71(in_register_00000081,normalize_loops);
  local_7c = (undefined4)CONCAT71(in_register_00000009,debug_override);
  local_89 = (S2Debug)str.length_;
  absl::string_view::string_view(&local_40,"empty");
  if ((pointer)local_40.length_ == psVar4) {
    if (psVar4 != (pointer)0x0 && (s2textformat *)local_40.ptr_ != this) {
      iVar2 = bcmp(this,local_40.ptr_,(size_t)psVar4);
      if (iVar2 != 0) goto LAB_0022f22c;
    }
    absl::string_view::string_view((string_view *)&local_58,"");
    this = (s2textformat *)
           local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
           _M_impl.super__Vector_impl_data._M_start;
    psVar4 = local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
LAB_0022f22c:
  str_01.length_ = 0x3b;
  str_01.ptr_ = (char *)psVar4;
  SplitString(&local_58,this,str_01,normalize_loops);
  local_78.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl
          .super__Vector_impl_data._M_start ==
          local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl
          .super__Vector_impl_data._M_finish;
  if (!bVar5) {
    psVar4 = local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_88._M_head_impl = (S2Loop *)0x0;
      str_00.length_ = (size_type)&local_88;
      str_00.ptr_ = (char *)psVar4->length_;
      bVar1 = MakeLoop((s2textformat *)psVar4->ptr_,str_00,
                       (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)(ulong)local_89,
                       normalize_loops);
      _Var3._M_head_impl = local_88._M_head_impl;
      if (!bVar1) {
        if ((pointer)local_88._M_head_impl == (pointer)0x0) goto LAB_0022f348;
        S2Loop::~S2Loop(local_88._M_head_impl);
        goto LAB_0022f340;
      }
      if (((char)local_7c != '\0') &&
         (((local_88._M_head_impl)->num_vertices_ != 1 ||
          (((local_88._M_head_impl)->origin_inside_ & 1U) == 0)))) {
        S2Loop::Normalize(local_88._M_head_impl);
      }
      std::
      vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
      ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
                ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                  *)&local_78,(unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)&local_88);
      _Var3._M_head_impl = local_88._M_head_impl;
      if ((pointer)local_88._M_head_impl != (pointer)0x0) {
        S2Loop::~S2Loop(local_88._M_head_impl);
        operator_delete(_Var3._M_head_impl);
      }
      if (!bVar1) goto LAB_0022f348;
      psVar4 = psVar4 + 1;
      bVar5 = psVar4 == local_58.
                        super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar5);
  }
  absl::
  make_unique<S2Polygon,std::vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>,S2Debug&>
            ((absl *)&local_88,&local_78,&local_89);
  _Var3._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (S2Loop *)0x0;
  std::__uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>::reset
            (local_60,(pointer)_Var3._M_head_impl);
  _Var3._M_head_impl = local_88._M_head_impl;
  if ((S2Polygon *)local_88._M_head_impl != (S2Polygon *)0x0) {
    S2Polygon::~S2Polygon((S2Polygon *)local_88._M_head_impl);
LAB_0022f340:
    operator_delete(_Var3._M_head_impl);
  }
LAB_0022f348:
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::~vector(&local_78);
  if (local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

static bool InternalMakePolygon(string_view str,
                                S2Debug debug_override,
                                bool normalize_loops,
                                unique_ptr<S2Polygon>* polygon) {
  if (str == "empty") str = "";
  vector<string_view> loop_strs = SplitString(str, ';');
  vector<unique_ptr<S2Loop>> loops;
  for (const auto& loop_str : loop_strs) {
    std::unique_ptr<S2Loop> loop;
    if (!MakeLoop(loop_str, &loop, debug_override)) return false;
    // Don't normalize loops that were explicitly specified as "full".
    if (normalize_loops && !loop->is_full()) loop->Normalize();
    loops.push_back(std::move(loop));
  }
  *polygon = make_unique<S2Polygon>(std::move(loops), debug_override);
  return true;
}